

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O0

int __thiscall FNodeBuilder::Heuristic(FNodeBuilder *this,node_t *node,DWORD set,bool honorNoSplit)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  FPrivSeg *seg;
  int *piVar7;
  FPrivVert *pFVar8;
  FPrivVert *pFVar9;
  int look;
  int penalty;
  double y;
  double x;
  FPrivVert *v2;
  FPrivVert *v1;
  FPrivSeg *test;
  double frac;
  uint local_68;
  uint q;
  uint p;
  uint m2;
  uint max;
  int iStack_54;
  bool splitter;
  int side;
  int sidev [2];
  DWORD i;
  int specialSegs [2];
  int realSegs [2];
  int counts [2];
  int segsInSet;
  int score;
  bool honorNoSplit_local;
  DWORD set_local;
  node_t *node_local;
  FNodeBuilder *this_local;
  
  counts[1] = 1000000;
  counts[0] = 0;
  memset(realSegs,0,8);
  memset(specialSegs,0,8);
  memset(sidev + 1,0,8);
  bVar3 = false;
  sidev[0] = set;
  TArray<int,_int>::Clear(&this->Touched);
  TArray<int,_int>::Clear(&this->Colinear);
  while (sidev[0] != -1) {
    seg = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                    (&this->Segs,(ulong)(uint)sidev[0]);
    if (this->HackSeg == sidev[0]) {
      max = 1;
    }
    else {
      pFVar8 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                         (&this->Vertices,(long)seg->v1);
      pFVar9 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                         (&this->Vertices,(long)seg->v2);
      max = ClassifyLine(this,node,pFVar8,pFVar9,&stack0xffffffffffffffac);
    }
    if (max < 2) {
      if (((seg->loopnum != 0) && (honorNoSplit)) && ((iStack_54 == 0 || (side == 0)))) {
        if (iStack_54 == 0 && side == 0) {
          uVar4 = TArray<int,_int>::Size(&this->Colinear);
          local_68 = 0;
          while ((local_68 < uVar4 &&
                 (piVar7 = TArray<int,_int>::operator[](&this->Colinear,(ulong)local_68),
                 *piVar7 != seg->loopnum))) {
            local_68 = local_68 + 1;
          }
          if (local_68 == uVar4) {
            TArray<int,_int>::Push(&this->Colinear,&seg->loopnum);
          }
        }
        else {
          uVar4 = TArray<int,_int>::Size(&this->Touched);
          local_68 = 0;
          while ((local_68 < uVar4 &&
                 (piVar7 = TArray<int,_int>::operator[](&this->Touched,(ulong)local_68),
                 *piVar7 != seg->loopnum))) {
            local_68 = local_68 + 1;
          }
          if (local_68 == uVar4) {
            TArray<int,_int>::Push(&this->Touched,&seg->loopnum);
          }
        }
      }
      realSegs[(int)max] = realSegs[(int)max] + 1;
      if (seg->linedef == -1) {
        counts[1] = counts[1] + 2;
      }
      else {
        specialSegs[(int)max] = specialSegs[(int)max] + 1;
        if (seg->frontsector == seg->backsector) {
          sidev[(long)(int)max + 1] = sidev[(long)(int)max + 1] + 1;
        }
        counts[1] = counts[1] + 8;
      }
    }
    else {
      if (seg->loopnum != 0) {
        if (honorNoSplit) {
          return -1;
        }
        bVar3 = true;
      }
      test = (FPrivSeg *)InterceptVector(this,node,seg);
      if (((double)test < 0.001) || (0.999 < (double)test)) {
        pFVar8 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                           (&this->Vertices,(long)seg->v1);
        pFVar9 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                           (&this->Vertices,(long)seg->v2);
        dVar1 = (double)(pFVar8->super_FSimpleVert).x;
        dVar2 = (double)(pFVar8->super_FSimpleVert).y;
        dVar1 = (double)test * ((double)(pFVar9->super_FSimpleVert).x - dVar1) + dVar1;
        dVar2 = (double)test * ((double)(pFVar9->super_FSimpleVert).y - dVar2) + dVar2;
        if ((ABS(dVar1 - (double)(pFVar8->super_FSimpleVert).x) < 7.0) &&
           (ABS(dVar2 - (double)(pFVar8->super_FSimpleVert).y) < 7.0)) {
          return -1;
        }
        if ((ABS(dVar1 - (double)(pFVar9->super_FSimpleVert).x) < 7.0) &&
           (ABS(dVar2 - (double)(pFVar9->super_FSimpleVert).y) < 7.0)) {
          return -1;
        }
        if (0.999 < (double)test) {
          test = (FPrivSeg *)(1.0 - (double)test);
        }
        counts[1] = MAX<int>(counts[1] - (int)(1.0 / (double)test),1);
      }
      realSegs[0] = realSegs[0] + 1;
      realSegs[1] = realSegs[1] + 1;
      if (seg->linedef != -1) {
        specialSegs[0] = specialSegs[0] + 1;
        specialSegs[1] = specialSegs[1] + 1;
        if (seg->frontsector == seg->backsector) {
          sidev[1] = sidev[1] + 1;
          i = i + 1;
        }
      }
    }
    counts[0] = counts[0] + 1;
    sidev[0] = seg->next;
  }
  if ((realSegs[0] == 0) || (realSegs[1] == 0)) {
    this_local._4_4_ = 0;
  }
  else if ((specialSegs[0] == 0) || (specialSegs[1] == 0)) {
    this_local._4_4_ = -1;
  }
  else if ((honorNoSplit) && ((sidev[1] == specialSegs[0] || (i == specialSegs[1])))) {
    this_local._4_4_ = -1;
  }
  else {
    uVar4 = TArray<int,_int>::Size(&this->Touched);
    uVar5 = TArray<int,_int>::Size(&this->Colinear);
    if ((uVar5 == 0) && (uVar4 != 0)) {
      this_local._4_4_ = -1;
    }
    else {
      for (local_68 = 0; local_68 < uVar4; local_68 = local_68 + 1) {
        piVar7 = TArray<int,_int>::operator[](&this->Touched,(ulong)local_68);
        iVar6 = *piVar7;
        frac._4_4_ = 0;
        while ((frac._4_4_ < uVar5 &&
               (piVar7 = TArray<int,_int>::operator[](&this->Colinear,(ulong)frac._4_4_),
               iVar6 != *piVar7))) {
          frac._4_4_ = frac._4_4_ + 1;
        }
        if (frac._4_4_ == uVar5) {
          return -1;
        }
      }
      if ((node->dx == 0) || (node->dy == 0)) {
        if (bVar3) {
          iVar6 = counts[0] * 8;
        }
        else {
          iVar6 = counts[0] / 0x10;
        }
        counts[1] = iVar6 + counts[1];
      }
      iVar6 = realSegs[0] - realSegs[1];
      if (iVar6 < 1) {
        iVar6 = -iVar6;
      }
      this_local._4_4_ = ((realSegs[0] + realSegs[1]) - iVar6) + counts[1];
    }
  }
  return this_local._4_4_;
}

Assistant:

int FNodeBuilder::Heuristic (node_t &node, DWORD set, bool honorNoSplit)
{
	// Set the initial score above 0 so that near vertex anti-weighting is less likely to produce a negative score.
	int score = 1000000;
	int segsInSet = 0;
	int counts[2] = { 0, 0 };
	int realSegs[2] = { 0, 0 };
	int specialSegs[2] = { 0, 0 };
	DWORD i = set;
	int sidev[2];
	int side;
	bool splitter = false;
	unsigned int max, m2, p, q;
	double frac;

	Touched.Clear ();
	Colinear.Clear ();

	while (i != DWORD_MAX)
	{
		const FPrivSeg *test = &Segs[i];

		if (HackSeg == i)
		{
			side = 1;
		}
		else
		{
			side = ClassifyLine (node, &Vertices[test->v1], &Vertices[test->v2], sidev);
		}
		switch (side)
		{
		case 0:	// Seg is on only one side of the partition
		case 1:
			// If we don't split this line, but it abuts the splitter, also reject it.
			// The "right" thing to do in this case is to only reject it if there is
			// another nosplit seg from the same sector at this vertex. Note that a line
			// that lies exactly on top of the splitter is okay.
			if (test->loopnum && honorNoSplit && (sidev[0] == 0 || sidev[1] == 0))
			{
				if ((sidev[0] | sidev[1]) != 0)
				{
					max = Touched.Size();
					for (p = 0; p < max; ++p)
					{
						if (Touched[p] == test->loopnum)
						{
							break;
						}
					}
					if (p == max)
					{
						Touched.Push (test->loopnum);
					}
				}
				else
				{
					max = Colinear.Size();
					for (p = 0; p < max; ++p)
					{
						if (Colinear[p] == test->loopnum)
						{
							break;
						}
					}
					if (p == max)
					{
						Colinear.Push (test->loopnum);
					}
				}
			}

			counts[side]++;
			if (test->linedef != -1)
			{
				realSegs[side]++;
				if (test->frontsector == test->backsector)
				{
					specialSegs[side]++;
				}
				// Add some weight to the score for unsplit lines
				score += SplitCost;	
			}
			else
			{
				// Minisegs don't count quite as much for nosplitting
				score += SplitCost / 4;
			}
			break;

		default:	// Seg is cut by the partition
			// If we are not allowed to split this seg, reject this splitter
			if (test->loopnum)
			{
				if (honorNoSplit)
				{
					D(Printf (PRINT_LOG, "Splits seg %d\n", i));
					return -1;
				}
				else
				{
					splitter = true;
				}
			}

			// Splitters that are too close to a vertex are bad.
			frac = InterceptVector (node, *test);
			if (frac < 0.001 || frac > 0.999)
			{
				FPrivVert *v1 = &Vertices[test->v1];
				FPrivVert *v2 = &Vertices[test->v2];
				double x = v1->x, y = v1->y;
				x += frac * (v2->x - x);
				y += frac * (v2->y - y);
				if (fabs(x - v1->x) < VERTEX_EPSILON+1 && fabs(y - v1->y) < VERTEX_EPSILON+1)
				{
					D(Printf("Splitter will produce same start vertex as seg %d\n", i));
					return -1;
				}
				if (fabs(x - v2->x) < VERTEX_EPSILON+1 && fabs(y - v2->y) < VERTEX_EPSILON+1)
				{
					D(Printf("Splitter will produce same end vertex as seg %d\n", i));
					return -1;
				}
				if (frac > 0.999)
				{
					frac = 1 - frac;
				}
				int penalty = int(1 / frac);
				score = MAX(score - penalty, 1);
				D(Printf ("Penalized splitter by %d for being near endpt of seg %d (%f).\n", penalty, i, frac));
			}

			counts[0]++;
			counts[1]++;
			if (test->linedef != -1)
			{
				realSegs[0]++;
				realSegs[1]++;
				if (test->frontsector == test->backsector)
				{
					specialSegs[0]++;
					specialSegs[1]++;
				}
			}
			break;
		}

		segsInSet++;
		i = test->next;
	}

	// If this line is outside all the others, return a special score
	if (counts[0] == 0 || counts[1] == 0)
	{
		return 0;
	}

	// A splitter must have at least one real seg on each side.
	// Otherwise, a subsector could be left without any way to easily
	// determine which sector it lies inside.
	if (realSegs[0] == 0 || realSegs[1] == 0)
	{
		D(Printf (PRINT_LOG, "Leaves a side with only mini segs\n"));
		return -1;
	}

	// Try to avoid splits that leave only "special" segs, so that the generated
	// subsectors have a better chance of choosing the correct sector. This situation
	// is not neccesarily bad, just undesirable.
	if (honorNoSplit && (specialSegs[0] == realSegs[0] || specialSegs[1] == realSegs[1]))
	{
		D(Printf (PRINT_LOG, "Leaves a side with only special segs\n"));
		return -1;
	}

	// If this splitter intersects any vertices of segs that should not be split,
	// check if it is also colinear with another seg from the same sector. If it
	// is, the splitter is okay. If not, it should be rejected. Why? Assuming that
	// polyobject containers are convex (which they should be), a splitter that
	// is colinear with one of the sector's segs and crosses the vertex of another
	// seg of that sector must be crossing the container's corner and does not
	// actually split the container.

	max = Touched.Size ();
	m2 = Colinear.Size ();

	// If honorNoSplit is false, then both these lists will be empty.

	// If the splitter touches some vertices without being colinear to any, we
	// can skip further checks and reject this right away.
	if (m2 == 0 && max > 0)
	{
		return -1;
	}

	for (p = 0; p < max; ++p)
	{
		int look = Touched[p];
		for (q = 0; q < m2; ++q)
		{
			if (look == Colinear[q])
			{
				break;
			}
		}
		if (q == m2)
		{ // Not a good one
			return -1;
		}
	}

	// Doom maps are primarily axis-aligned lines, so it's usually a good
	// idea to prefer axis-aligned splitters over diagonal ones. Doom originally
	// had special-casing for orthogonal lines, so they performed better. ZDoom
	// does not care about the line's direction, so this is merely a choice to
	// try and improve the final tree.

	if ((node.dx == 0) || (node.dy == 0))
	{
		// If we have to split a seg we would prefer to keep unsplit, give
		// extra precedence to orthogonal lines so that the polyobjects
		// outside the entrance to MAP06 in Hexen MAP02 display properly.
		if (splitter)
		{
			score += segsInSet*8;
		}
		else
		{
			score += segsInSet/AAPreference;
		}
	}

	score += (counts[0] + counts[1]) - abs(counts[0] - counts[1]);

	return score;
}